

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QByteArrayView>::relocate
          (QArrayDataPointer<QByteArrayView> *this,qsizetype offset,QByteArrayView **data)

{
  bool bVar1;
  QByteArrayView *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QByteArrayView *res;
  
  first = (QByteArrayView *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<QByteArrayView,long_long>(first,in_RDI,(QByteArrayView *)0x7460e7)
  ;
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QByteArrayView>,QByteArrayView_const*>
                        (data,(QArrayDataPointer<QByteArrayView> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(QByteArrayView **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }